

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O1

int64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getSmallInt(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  uint64_t uVar4;
  int64_t iVar5;
  ulong uVar6;
  Exception *pEVar7;
  ulong uVar8;
  long lVar9;
  
  bVar1 = **(byte **)this;
  if ((byte)(bVar1 - 0x30) < 10) {
    return (ulong)(bVar1 & 0xf);
  }
  if ((byte)(bVar1 - 0x3a) < 6) {
    return (long)(char)bVar1 | 0xffffffffffffffc0;
  }
  if (((int)(char)bVar1 & 0xf0U | 8) != 0x28) {
    pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(pEVar7,InvalidValueType,"Expecting type SmallInt");
    __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
  }
  pbVar3 = *(byte **)this;
  bVar1 = *pbVar3;
  if ((bVar1 & 0xf8) == 0x28) {
    uVar4 = getUIntUnchecked(this);
    if (-1 < (long)uVar4) {
      return uVar4;
    }
    pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(pEVar7,NumberOutOfRange);
LAB_0010caff:
    __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
  }
  if ((bVar1 & 0xf8) != 0x20) {
    if ((bVar1 & 0xf0) == 0x30) {
      iVar5 = getSmallIntUnchecked(this);
      return iVar5;
    }
    pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(pEVar7,InvalidValueType,"Expecting type Int");
    goto LAB_0010caff;
  }
  switch(bVar1) {
  case 0x20:
    uVar6 = (ulong)pbVar3[1];
    break;
  case 0x21:
    uVar6 = (ulong)*(ushort *)(pbVar3 + 1);
    break;
  case 0x22:
    uVar8 = (ulong)((uint)pbVar3[2] << 8 | (uint)pbVar3[3] << 0x10);
    uVar6 = (ulong)pbVar3[1];
    goto LAB_0010cab2;
  case 0x23:
    uVar6 = (ulong)*(uint *)(pbVar3 + 1);
    break;
  case 0x24:
    uVar2 = *(uint *)(pbVar3 + 1);
    uVar6 = (ulong)pbVar3[5];
    goto LAB_0010ca95;
  case 0x25:
    uVar2 = *(uint *)(pbVar3 + 1);
    uVar6 = (ulong)*(ushort *)(pbVar3 + 5);
LAB_0010ca95:
    uVar6 = uVar6 << 0x20 | (ulong)uVar2;
    break;
  case 0x26:
    uVar8 = (ulong)*(uint3 *)(pbVar3 + 5) << 0x20;
    uVar6 = (ulong)*(uint *)(pbVar3 + 1);
LAB_0010cab2:
    uVar6 = uVar6 | uVar8;
    break;
  case 0x27:
    uVar6 = *(ulong *)(pbVar3 + 1);
    break;
  default:
    uVar6 = 0;
  }
  if (bVar1 != 0x27) {
    lVar9 = 0;
    if (*(long *)((anonymous_namespace)::maxValues + (ulong)(bVar1 - 0x20) * 8) <= (long)uVar6) {
      lVar9 = *(long *)((anonymous_namespace)::maxValues + (ulong)(bVar1 - 0x20) * 8) * 2;
    }
    uVar6 = uVar6 - lVar9;
  }
  return uVar6;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }